

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.cpp
# Opt level: O1

void ContextBlockSplitterFinishBlock(ContextBlockSplitter *self,MemoryManager *m,int is_final)

{
  int *piVar1;
  long *plVar2;
  uint32_t uVar3;
  BlockSplit *pBVar4;
  ulong uVar5;
  uint32_t *puVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  size_t sVar11;
  double *pdVar12;
  HistogramLiteral *pHVar13;
  HistogramLiteral *pHVar14;
  ulong uVar15;
  uint *__dest;
  double *pdVar16;
  uint *puVar17;
  ulong uVar18;
  void *pvVar19;
  long lVar20;
  bool bVar21;
  double dVar22;
  undefined4 uVar27;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar28;
  undefined1 auVar26 [16];
  double dVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double diff [2];
  double entropy [13];
  double combined_entropy [26];
  void *local_210;
  double local_1d8 [2];
  HistogramLiteral *local_1c8;
  MemoryManager *local_1c0;
  void *local_1b8;
  long local_1b0;
  HistogramLiteral *local_1a8;
  HistogramLiteral *local_1a0;
  double local_198;
  double dStack_190;
  double local_188;
  double dStack_180;
  double adStack_178 [14];
  double local_108 [27];
  
  if (self->block_size_ < self->min_block_size_) {
    self->block_size_ = self->min_block_size_;
  }
  pBVar4 = self->split_;
  uVar5 = self->num_contexts_;
  pHVar13 = self->histograms_;
  if (self->num_blocks_ == 0) {
    *pBVar4->lengths = (uint32_t)self->block_size_;
    *pBVar4->types = '\0';
    if (uVar5 != 0) {
      uVar18 = 0;
      do {
        uVar15 = self->alphabet_size_;
        dVar29 = 0.0;
        uVar10 = 0;
        pHVar14 = pHVar13;
        if ((uVar15 & 1) != 0) goto LAB_0032b40b;
        while (pHVar14 < (HistogramLiteral *)(pHVar13->data_ + uVar15)) {
          uVar7 = (ulong)pHVar14->data_[0];
          pHVar14 = (HistogramLiteral *)(pHVar14->data_ + 1);
          uVar10 = uVar10 + uVar7;
          if (uVar7 < 0x100) {
            dVar22 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar7];
          }
          else {
            dVar22 = log2((double)uVar7);
          }
          dVar29 = dVar29 - (double)uVar7 * dVar22;
LAB_0032b40b:
          uVar7 = (ulong)pHVar14->data_[0];
          pHVar14 = (HistogramLiteral *)(pHVar14->data_ + 1);
          uVar10 = uVar10 + uVar7;
          if (uVar7 < 0x100) {
            dVar22 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar7];
          }
          else {
            dVar22 = log2((double)uVar7);
          }
          dVar29 = dVar29 - (double)uVar7 * dVar22;
        }
        uVar27 = (undefined4)(uVar10 >> 0x20);
        if (uVar10 != 0) {
          auVar23._8_4_ = uVar27;
          auVar23._0_8_ = uVar10;
          auVar23._12_4_ = 0x45300000;
          dVar22 = (auVar23._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0);
          if (uVar10 < 0x100) {
            dVar28 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar10];
          }
          else {
            dVar28 = log2(dVar22);
          }
          dVar29 = dVar29 + dVar22 * dVar28;
        }
        auVar30._8_4_ = uVar27;
        auVar30._0_8_ = uVar10;
        auVar30._12_4_ = 0x45300000;
        dVar22 = (auVar30._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0);
        if (dVar22 <= dVar29) {
          dVar22 = dVar29;
        }
        self->last_entropy_[uVar18] = dVar22;
        self->last_entropy_[uVar5 + uVar18] = dVar22;
        uVar18 = uVar18 + 1;
        pHVar13 = pHVar13 + 1;
      } while (uVar5 != uVar18);
    }
    self->num_blocks_ = self->num_blocks_ + 1;
    pBVar4->num_types = pBVar4->num_types + 1;
    uVar18 = self->curr_histogram_ix_ + uVar5;
    self->curr_histogram_ix_ = uVar18;
    if ((uVar18 < *self->histograms_size_) && (sVar11 = self->num_contexts_, sVar11 != 0)) {
      pHVar13 = self->histograms_ + uVar18;
      do {
        memset(pHVar13,0,0x408);
        pHVar13->bit_cost_ = INFINITY;
        pHVar13 = pHVar13 + 1;
        sVar11 = sVar11 - 1;
      } while (sVar11 != 0);
    }
    self->block_size_ = 0;
  }
  else if (self->block_size_ != 0) {
    local_1c0 = m;
    if ((uVar5 & 0x7fffffffffffffff) == 0) {
      local_210 = (void *)0x0;
    }
    else {
      local_210 = duckdb_brotli::BrotliAllocate(m,uVar5 * 0x820);
    }
    pdVar16 = self->last_entropy_;
    local_1d8[0] = 0.0;
    local_1d8[1] = 0.0;
    if (uVar5 != 0) {
      local_1b0 = uVar5 * 0x410;
      uVar18 = 0;
      pvVar19 = local_210;
      local_1c8 = pHVar13;
      do {
        local_1a8 = pHVar13 + uVar18;
        pHVar14 = local_1a8 + self->curr_histogram_ix_;
        uVar15 = self->alphabet_size_;
        puVar6 = pHVar14->data_;
        dVar29 = 0.0;
        uVar10 = 0;
        local_1a0 = pHVar14;
        if ((uVar15 & 1) != 0) goto LAB_0032b6a2;
        while (pHVar14 < (HistogramLiteral *)(puVar6 + uVar15)) {
          uVar7 = (ulong)pHVar14->data_[0];
          pHVar14 = (HistogramLiteral *)(pHVar14->data_ + 1);
          uVar10 = uVar10 + uVar7;
          if (uVar7 < 0x100) {
            dVar22 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar7];
          }
          else {
            dVar22 = log2((double)uVar7);
          }
          dVar29 = dVar29 - (double)uVar7 * dVar22;
LAB_0032b6a2:
          uVar7 = (ulong)pHVar14->data_[0];
          pHVar14 = (HistogramLiteral *)(pHVar14->data_ + 1);
          uVar10 = uVar10 + uVar7;
          if (uVar7 < 0x100) {
            dVar22 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar7];
          }
          else {
            dVar22 = log2((double)uVar7);
          }
          dVar29 = dVar29 - (double)uVar7 * dVar22;
        }
        uVar27 = (undefined4)(uVar10 >> 0x20);
        if (uVar10 != 0) {
          auVar24._8_4_ = uVar27;
          auVar24._0_8_ = uVar10;
          auVar24._12_4_ = 0x45300000;
          dVar22 = (auVar24._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0);
          if (uVar10 < 0x100) {
            dVar28 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar10];
          }
          else {
            dVar28 = log2(dVar22);
          }
          dVar29 = dVar29 + dVar22 * dVar28;
        }
        auVar31._8_4_ = uVar27;
        auVar31._0_8_ = uVar10;
        auVar31._12_4_ = 0x45300000;
        dStack_180 = auVar31._8_8_ - 1.9342813113834067e+25;
        local_188 = dStack_180 + ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0);
        if (local_188 <= dVar29) {
          local_188 = dVar29;
        }
        adStack_178[uVar18] = local_188;
        lVar20 = 0;
        local_1b8 = pvVar19;
        do {
          lVar8 = lVar20 * uVar5 + uVar18;
          __dest = (uint *)((long)local_210 + lVar8 * 0x410);
          sVar11 = self->last_histogram_ix_[lVar20];
          switchD_00337c71::default(__dest,local_1a0,0x410);
          plVar2 = (long *)((long)local_210 + lVar8 * 0x410 + 0x400);
          *plVar2 = *plVar2 + local_1a8[sVar11].total_count_;
          lVar9 = 0;
          do {
            piVar1 = (int *)((long)pvVar19 + lVar9 * 4);
            *piVar1 = *piVar1 + local_1c8[sVar11].data_[lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar9 != 0x100);
          puVar17 = __dest + self->alphabet_size_;
          dVar29 = 0.0;
          uVar15 = 0;
          if ((self->alphabet_size_ & 1) != 0) goto LAB_0032b8be;
          while (__dest < puVar17) {
            uVar10 = (ulong)*__dest;
            __dest = __dest + 1;
            uVar15 = uVar15 + uVar10;
            if (uVar10 < 0x100) {
              dVar22 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar10];
            }
            else {
              dVar22 = log2((double)uVar10);
            }
            dVar29 = dVar29 - (double)uVar10 * dVar22;
LAB_0032b8be:
            uVar10 = (ulong)*__dest;
            __dest = __dest + 1;
            uVar15 = uVar15 + uVar10;
            if (uVar10 < 0x100) {
              dVar22 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar10];
            }
            else {
              dVar22 = log2((double)uVar10);
            }
            dVar29 = dVar29 - (double)uVar10 * dVar22;
          }
          uVar27 = (undefined4)(uVar15 >> 0x20);
          if (uVar15 != 0) {
            auVar25._8_4_ = uVar27;
            auVar25._0_8_ = uVar15;
            auVar25._12_4_ = 0x45300000;
            dVar28 = auVar25._8_8_ - 1.9342813113834067e+25;
            dVar22 = dVar28 + ((double)CONCAT44(0x43300000,(int)uVar15) - 4503599627370496.0);
            if (uVar15 < 0x100) {
              dVar28 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar15];
            }
            else {
              local_198 = dVar22;
              dStack_190 = dVar28;
              dVar28 = log2(dVar22);
              dVar22 = local_198;
            }
            dVar29 = dVar29 + dVar22 * dVar28;
          }
          auVar32._8_4_ = uVar27;
          auVar32._0_8_ = uVar15;
          auVar32._12_4_ = 0x45300000;
          dVar22 = (auVar32._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar15) - 4503599627370496.0);
          if (dVar22 <= dVar29) {
            dVar22 = dVar29;
          }
          local_108[lVar8] = dVar22;
          local_1d8[lVar20] = ((dVar22 - local_188) - pdVar16[lVar8]) + local_1d8[lVar20];
          pvVar19 = (void *)((long)pvVar19 + local_1b0);
          bVar21 = lVar20 == 0;
          lVar20 = lVar20 + 1;
        } while (bVar21);
        uVar18 = uVar18 + 1;
        local_1c8 = local_1c8 + 1;
        pvVar19 = (void *)((long)local_1b8 + 0x410);
      } while (uVar18 != uVar5);
    }
    uVar18 = pBVar4->num_types;
    if (((self->max_block_types_ <= uVar18) || (local_1d8[0] <= self->split_threshold_)) ||
       (local_1d8[1] <= self->split_threshold_)) {
      uVar3 = (uint32_t)self->block_size_;
      sVar11 = self->num_blocks_;
      if (local_1d8[0] + -20.0 <= local_1d8[1]) {
        puVar6 = pBVar4->lengths + (sVar11 - 1);
        *puVar6 = *puVar6 + uVar3;
        if (uVar5 != 0) {
          pdVar12 = local_108;
          lVar20 = 0;
          uVar18 = uVar5;
          do {
            switchD_00337c71::default
                      ((void *)((long)pHVar13[self->last_histogram_ix_[0]].data_ + lVar20),
                       (void *)((long)local_210 + lVar20),0x410);
            dVar29 = *pdVar12;
            *pdVar16 = dVar29;
            if (pBVar4->num_types == 1) {
              pdVar16[uVar5] = dVar29;
            }
            sVar11 = self->curr_histogram_ix_;
            memset((void *)((long)pHVar13[sVar11].data_ + lVar20),0,0x408);
            *(undefined8 *)((long)&pHVar13[sVar11].bit_cost_ + lVar20) = 0x7ff0000000000000;
            pdVar16 = pdVar16 + 1;
            pdVar12 = pdVar12 + 1;
            lVar20 = lVar20 + 0x410;
            uVar18 = uVar18 - 1;
          } while (uVar18 != 0);
        }
        self->block_size_ = 0;
        uVar18 = self->merge_last_count_ + 1;
        self->merge_last_count_ = uVar18;
        if (1 < uVar18) {
          self->target_block_size_ = self->target_block_size_ + self->min_block_size_;
        }
      }
      else {
        pBVar4->lengths[sVar11] = uVar3;
        pBVar4->types[sVar11] = pBVar4->types[sVar11 - 2];
        auVar23 = *(undefined1 (*) [16])self->last_histogram_ix_;
        auVar26._0_8_ = auVar23._8_8_;
        auVar26._8_4_ = auVar23._0_4_;
        auVar26._12_4_ = auVar23._4_4_;
        *(undefined1 (*) [16])self->last_histogram_ix_ = auVar26;
        if (uVar5 != 0) {
          pdVar12 = local_108 + uVar5;
          lVar20 = 0;
          uVar18 = uVar5;
          do {
            switchD_00337c71::default
                      ((void *)((long)pHVar13[self->last_histogram_ix_[0]].data_ + lVar20),
                       (void *)((long)local_210 + lVar20 + uVar5 * 0x410),0x410);
            pdVar16[uVar5] = *pdVar16;
            *pdVar16 = *pdVar12;
            sVar11 = self->curr_histogram_ix_;
            memset((void *)((long)pHVar13[sVar11].data_ + lVar20),0,0x408);
            *(undefined8 *)((long)&pHVar13[sVar11].bit_cost_ + lVar20) = 0x7ff0000000000000;
            pdVar16 = pdVar16 + 1;
            pdVar12 = pdVar12 + 1;
            lVar20 = lVar20 + 0x410;
            uVar18 = uVar18 - 1;
          } while (uVar18 != 0);
        }
        self->num_blocks_ = self->num_blocks_ + 1;
        self->block_size_ = 0;
        self->merge_last_count_ = 0;
        self->target_block_size_ = self->min_block_size_;
      }
    }
    else {
      sVar11 = self->num_blocks_;
      pBVar4->lengths[sVar11] = (uint32_t)self->block_size_;
      pBVar4->types[sVar11] = (uint8_t)uVar18;
      self->last_histogram_ix_[1] = self->last_histogram_ix_[0];
      self->last_histogram_ix_[0] = pBVar4->num_types * uVar5;
      if (uVar5 != 0) {
        uVar18 = 0;
        do {
          pdVar16[uVar5 + uVar18] = pdVar16[uVar18];
          pdVar16[uVar18] = adStack_178[uVar18];
          uVar18 = uVar18 + 1;
        } while (uVar5 != uVar18);
      }
      self->num_blocks_ = self->num_blocks_ + 1;
      pBVar4->num_types = pBVar4->num_types + 1;
      uVar18 = self->curr_histogram_ix_ + uVar5;
      self->curr_histogram_ix_ = uVar18;
      if ((uVar18 < *self->histograms_size_) && (sVar11 = self->num_contexts_, sVar11 != 0)) {
        pHVar13 = self->histograms_ + uVar18;
        do {
          memset(pHVar13,0,0x408);
          pHVar13->bit_cost_ = INFINITY;
          pHVar13 = pHVar13 + 1;
          sVar11 = sVar11 - 1;
        } while (sVar11 != 0);
      }
      self->block_size_ = 0;
      self->merge_last_count_ = 0;
      self->target_block_size_ = self->min_block_size_;
    }
    duckdb_brotli::BrotliFree(local_1c0,local_210);
  }
  if (is_final != 0) {
    *self->histograms_size_ = uVar5 * pBVar4->num_types;
    pBVar4->num_blocks = self->num_blocks_;
  }
  return;
}

Assistant:

static void ContextBlockSplitterFinishBlock(
    ContextBlockSplitter* self, MemoryManager* m, BROTLI_BOOL is_final) {
  BlockSplit* split = self->split_;
  const size_t num_contexts = self->num_contexts_;
  double* last_entropy = self->last_entropy_;
  HistogramLiteral* histograms = self->histograms_;

  if (self->block_size_ < self->min_block_size_) {
    self->block_size_ = self->min_block_size_;
  }
  if (self->num_blocks_ == 0) {
    size_t i;
    /* Create first block. */
    split->lengths[0] = (uint32_t)self->block_size_;
    split->types[0] = 0;

    for (i = 0; i < num_contexts; ++i) {
      last_entropy[i] =
          BitsEntropy(histograms[i].data_, self->alphabet_size_);
      last_entropy[num_contexts + i] = last_entropy[i];
    }
    ++self->num_blocks_;
    ++split->num_types;
    self->curr_histogram_ix_ += num_contexts;
    if (self->curr_histogram_ix_ < *self->histograms_size_) {
      ClearHistogramsLiteral(
          &self->histograms_[self->curr_histogram_ix_], self->num_contexts_);
    }
    self->block_size_ = 0;
  } else if (self->block_size_ > 0) {
    /* Try merging the set of histograms for the current block type with the
       respective set of histograms for the last and second last block types.
       Decide over the split based on the total reduction of entropy across
       all contexts. */
    double entropy[BROTLI_MAX_STATIC_CONTEXTS];
    HistogramLiteral* combined_histo =
        BROTLI_ALLOC(m, HistogramLiteral, 2 * num_contexts);
    double combined_entropy[2 * BROTLI_MAX_STATIC_CONTEXTS];
    double diff[2] = { 0.0 };
    size_t i;
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(combined_histo)) return;
    for (i = 0; i < num_contexts; ++i) {
      size_t curr_histo_ix = self->curr_histogram_ix_ + i;
      size_t j;
      entropy[i] = BitsEntropy(histograms[curr_histo_ix].data_,
                               self->alphabet_size_);
      for (j = 0; j < 2; ++j) {
        size_t jx = j * num_contexts + i;
        size_t last_histogram_ix = self->last_histogram_ix_[j] + i;
        combined_histo[jx] = histograms[curr_histo_ix];
        HistogramAddHistogramLiteral(&combined_histo[jx],
            &histograms[last_histogram_ix]);
        combined_entropy[jx] = BitsEntropy(
            &combined_histo[jx].data_[0], self->alphabet_size_);
        diff[j] += combined_entropy[jx] - entropy[i] - last_entropy[jx];
      }
    }

    if (split->num_types < self->max_block_types_ &&
        diff[0] > self->split_threshold_ &&
        diff[1] > self->split_threshold_) {
      /* Create new block. */
      split->lengths[self->num_blocks_] = (uint32_t)self->block_size_;
      split->types[self->num_blocks_] = (uint8_t)split->num_types;
      self->last_histogram_ix_[1] = self->last_histogram_ix_[0];
      self->last_histogram_ix_[0] = split->num_types * num_contexts;
      for (i = 0; i < num_contexts; ++i) {
        last_entropy[num_contexts + i] = last_entropy[i];
        last_entropy[i] = entropy[i];
      }
      ++self->num_blocks_;
      ++split->num_types;
      self->curr_histogram_ix_ += num_contexts;
      if (self->curr_histogram_ix_ < *self->histograms_size_) {
        ClearHistogramsLiteral(
            &self->histograms_[self->curr_histogram_ix_], self->num_contexts_);
      }
      self->block_size_ = 0;
      self->merge_last_count_ = 0;
      self->target_block_size_ = self->min_block_size_;
    } else if (diff[1] < diff[0] - 20.0) {
      /* Combine this block with second last block. */
      split->lengths[self->num_blocks_] = (uint32_t)self->block_size_;
      split->types[self->num_blocks_] = split->types[self->num_blocks_ - 2];
      BROTLI_SWAP(size_t, self->last_histogram_ix_, 0, 1);
      for (i = 0; i < num_contexts; ++i) {
        histograms[self->last_histogram_ix_[0] + i] =
            combined_histo[num_contexts + i];
        last_entropy[num_contexts + i] = last_entropy[i];
        last_entropy[i] = combined_entropy[num_contexts + i];
        HistogramClearLiteral(&histograms[self->curr_histogram_ix_ + i]);
      }
      ++self->num_blocks_;
      self->block_size_ = 0;
      self->merge_last_count_ = 0;
      self->target_block_size_ = self->min_block_size_;
    } else {
      /* Combine this block with last block. */
      split->lengths[self->num_blocks_ - 1] += (uint32_t)self->block_size_;
      for (i = 0; i < num_contexts; ++i) {
        histograms[self->last_histogram_ix_[0] + i] = combined_histo[i];
        last_entropy[i] = combined_entropy[i];
        if (split->num_types == 1) {
          last_entropy[num_contexts + i] = last_entropy[i];
        }
        HistogramClearLiteral(&histograms[self->curr_histogram_ix_ + i]);
      }
      self->block_size_ = 0;
      if (++self->merge_last_count_ > 1) {
        self->target_block_size_ += self->min_block_size_;
      }
    }
    BROTLI_FREE(m, combined_histo);
  }
  if (is_final) {
    *self->histograms_size_ = split->num_types * num_contexts;
    split->num_blocks = self->num_blocks_;
  }
}